

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O2

void ponger_read_cb(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  long lVar2;
  uv_write_t *req;
  undefined8 uVar3;
  char *__format;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  undefined8 uVar8;
  int64_t eval_b;
  int64_t eval_b_1;
  int64_t eval_a;
  int64_t local_18;
  
  if (nread < 0) {
    local_18 = eval_a;
    eval_a = nread;
    if (nread == -0xfff) {
      puts("got EOF");
      free(buf->base);
      uv_close((uv_handle_t *)stream,ponger_on_close);
      return;
    }
    pcVar6 = "UV_EOF";
    pcVar4 = "nread";
    uVar3 = 0xab;
    uVar8 = 0xfffffffffffff001;
  }
  else {
    for (lVar2 = 0; pcVar4 = buf->base, nread != lVar2; lVar2 = lVar2 + 1) {
      if (pcVar4[lVar2] == 'I') {
        pcVar4[lVar2] = 'O';
      }
    }
    _eval_a = uv_buf_init(pcVar4,nread);
    req = (uv_write_t *)malloc(200);
    if (req == (uv_write_t *)0x0) {
      pcVar5 = "!=";
      uVar8 = 0;
      pcVar7 = "!=";
      nread = 0;
      pcVar6 = "NULL";
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
      pcVar4 = "req";
      uVar3 = 0xbd;
      goto LAB_0015b0a9;
    }
    req->data = buf->base;
    iVar1 = uv_write(req,stream,(uv_buf_t *)&eval_a,1,pinger_after_write);
    nread = (ssize_t)iVar1;
    if (nread == 0) {
      return;
    }
    pcVar6 = "0";
    pcVar4 = "uv_write(req, stream, &writebuf, 1, pinger_after_write)";
    uVar3 = 0xbf;
    uVar8 = 0;
  }
  pcVar7 = "==";
  pcVar5 = "==";
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
LAB_0015b0a9:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
          ,uVar3,pcVar4,pcVar5,pcVar6,nread,pcVar7,uVar8);
  abort();
}

Assistant:

static void ponger_read_cb(uv_stream_t* stream,
                           ssize_t nread,
                           const uv_buf_t* buf) {
  uv_buf_t writebuf;
  uv_write_t* req;
  int i;

  if (nread < 0) {
    ASSERT_EQ(nread, UV_EOF);

    puts("got EOF");
    free(buf->base);

    uv_close((uv_handle_t*) stream, ponger_on_close);

    return;
  }

  /* Echo back */
  for (i = 0; i < nread; i++) {
    if (buf->base[i] == 'I')
      buf->base[i] = 'O';
  }

  writebuf = uv_buf_init(buf->base, nread);
  req = malloc(sizeof(*req));
  ASSERT_NOT_NULL(req);
  req->data = buf->base;
  ASSERT_OK(uv_write(req, stream, &writebuf, 1, pinger_after_write));
}